

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloat4Color
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_1ac;
  undefined1 local_1a0 [384];
  
  local_1ac.m_preguard[0] = 0xde;
  local_1ac.m_preguard[1] = 0xde;
  local_1ac.m_preguard[2] = 0xde;
  local_1ac.m_preguard[3] = 0xde;
  local_1ac.m_value[0] = 0xde;
  local_1ac.m_value[1] = 0xde;
  local_1ac.m_value[2] = 0xde;
  local_1ac.m_value[3] = 0xde;
  local_1ac.m_postguard[0] = 0xde;
  local_1ac.m_postguard[1] = 0xde;
  local_1ac.m_postguard[2] = 0xde;
  local_1ac.m_postguard[3] = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1ac.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    (&local_1ac,testCtx);
  if ((bVar1) &&
     (((((bool)local_1ac.m_value[0] != (reference0 != 0.0) ||
        ((bool)local_1ac.m_value[1] != (reference1 != 0.0))) ||
       ((bool)local_1ac.m_value[2] != (reference2 != 0.0))) ||
      ((bool)local_1ac.m_value[3] != (reference3 != 0.0))))) {
    local_1a0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar3 = "GL_FALSE";
    pcVar2 = "GL_FALSE";
    if (reference0 != 0.0) {
      pcVar2 = "GL_TRUE";
    }
    if (NAN(reference0)) {
      pcVar2 = "GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2,8 - (ulong)(-(uint)(reference0 != 0.0) & 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar2 = "GL_FALSE";
    if (reference1 != 0.0) {
      pcVar2 = "GL_TRUE";
    }
    if (NAN(reference1)) {
      pcVar2 = "GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2,8 - (ulong)(-(uint)(reference1 != 0.0) & 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar2 = "GL_FALSE";
    if (reference2 != 0.0) {
      pcVar2 = "GL_TRUE";
    }
    if (NAN(reference2)) {
      pcVar2 = "GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2,8 - (ulong)(-(uint)(reference2 != 0.0) & 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    if (reference3 != 0.0) {
      pcVar3 = "GL_TRUE";
    }
    if (NAN(reference3)) {
      pcVar3 = "GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar3,8 - (ulong)(-(uint)(reference3 != 0.0) & 1));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference1 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference2 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference3 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
	};

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	if (boolVector4[0] != referenceAsGLBoolean[0] ||
		boolVector4[1] != referenceAsGLBoolean[1] ||
		boolVector4[2] != referenceAsGLBoolean[2] ||
		boolVector4[3] != referenceAsGLBoolean[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}